

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typevisitor.hh
# Opt level: O2

void __thiscall
Typelib::UnsupportedType::UnsupportedType(UnsupportedType *this,Type *type_,string *reason_)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  Type::getName_abi_cxx11_(&local_40,type_);
  std::operator+(&local_a0,"type ",&local_40);
  std::operator+(&local_80,&local_a0," not supported: ");
  std::operator+(&local_60,&local_80,reason_);
  TypeException::TypeException(&this->super_TypeException,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_40);
  *(undefined ***)&this->super_TypeException = &PTR__UnsupportedType_0016bcb8;
  this->type = type_;
  std::__cxx11::string::string((string *)&this->reason,(string *)reason_);
  return;
}

Assistant:

UnsupportedType(Type const& type_, std::string const& reason_)
            : TypeException("type " + type_.getName() + " not supported: " + reason_), type(type_), reason(reason_) {}